

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fRboStateQueryTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::anon_unknown_1::RboComponentSizeColorCase::test
          (RboComponentSizeColorCase *this)

{
  CallLogWrapper *this_00;
  int r;
  uint in_EAX;
  long lVar1;
  ulong uStack_38;
  GLuint renderbufferID;
  
  uStack_38 = (ulong)in_EAX;
  this_00 = &(this->super_ApiCase).super_CallLogWrapper;
  glu::CallLogWrapper::glGenRenderbuffers(this_00,1,&renderbufferID);
  glu::CallLogWrapper::glBindRenderbuffer(this_00,0x8d41,renderbufferID);
  ApiCase::expectError(&this->super_ApiCase,0);
  checkRenderbufferComponentSize
            ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,this_00,0,
             0,0,0,0,0);
  ApiCase::expectError(&this->super_ApiCase,0);
  for (lVar1 = 0; lVar1 != 0x3c; lVar1 = lVar1 + 0x14) {
    r = *(int *)((long)&DAT_018240d4 + lVar1);
    glu::CallLogWrapper::glRenderbufferStorage
              (this_00,0x8d41,*(GLenum *)((long)&DAT_018240d0 + lVar1),1,1);
    ApiCase::expectError(&this->super_ApiCase,0);
    checkRenderbufferComponentSize
              ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,this_00,
               r,*(int *)((long)&DAT_018240d8 + lVar1),*(int *)((long)&DAT_018240dc + lVar1),
               *(int *)((long)&DAT_018240e0 + lVar1),-1,-1);
  }
  glu::CallLogWrapper::glDeleteRenderbuffers(this_00,1,&renderbufferID);
  return;
}

Assistant:

void test (void)
	{
		GLuint renderbufferID = 0;
		glGenRenderbuffers(1, &renderbufferID);
		glBindRenderbuffer(GL_RENDERBUFFER, renderbufferID);
		expectError(GL_NO_ERROR);

		checkRenderbufferComponentSize(m_testCtx, *this, 0, 0, 0, 0, 0, 0);
		expectError(GL_NO_ERROR);

		const struct ColorFormat
		{
			GLenum	internalFormat;
			int		bitsR, bitsG, bitsB, bitsA;
		} requiredColorFormats[] =
		{
			{ GL_RGBA4,			4,	4,	4,	4	},
			{ GL_RGB5_A1,		5,	5,	5,	1	},
			{ GL_RGB565,		5,	6,	5,	0	},
		};

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(requiredColorFormats); ++ndx)
		{
			glRenderbufferStorage(GL_RENDERBUFFER, requiredColorFormats[ndx].internalFormat, 1, 1);
			expectError(GL_NO_ERROR);

			checkRenderbufferComponentSize(m_testCtx, *this, requiredColorFormats[ndx].bitsR, requiredColorFormats[ndx].bitsG, requiredColorFormats[ndx].bitsB, requiredColorFormats[ndx].bitsA, -1, -1);
		}

		glDeleteRenderbuffers(1, &renderbufferID);
	}